

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_WhenNoFunctionPointerReturnValueIsExpectedButThereIsADefaultShouldlUseTheDefaultValue_Test
::testBody(TEST_MockReturnValueTest_WhenNoFunctionPointerReturnValueIsExpectedButThereIsADefaultShouldlUseTheDefaultValue_Test
           *this)

{
  undefined8 uVar1;
  int iVar2;
  MockSupport *pMVar3;
  UtestShell *pUVar4;
  undefined4 extraout_var;
  undefined8 uVar5;
  TestTerminator *pTVar6;
  undefined4 extraout_var_00;
  SimpleString local_78;
  SimpleString local_68;
  SimpleString local_58;
  SimpleString local_48 [2];
  SimpleString local_28;
  undefined8 local_18;
  _func_void *default_return_value;
  TEST_MockReturnValueTest_WhenNoFunctionPointerReturnValueIsExpectedButThereIsADefaultShouldlUseTheDefaultValue_Test
  *this_local;
  
  local_18 = 0x10;
  default_return_value = (_func_void *)this;
  SimpleString::SimpleString(&local_28,"");
  pMVar3 = mock(&local_28,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_48,"foo");
  (*pMVar3->_vptr_MockSupport[3])(pMVar3,local_48);
  SimpleString::~SimpleString(local_48);
  SimpleString::~SimpleString(&local_28);
  pUVar4 = UtestShell::getCurrent();
  uVar1 = local_18;
  SimpleString::SimpleString(&local_58,"");
  pMVar3 = mock(&local_58,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_68,"foo");
  iVar2 = (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_68);
  uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x168))
                    ((long *)CONCAT44(extraout_var,iVar2),local_18);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x14])
            (pUVar4,uVar1,uVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x2bf,pTVar6);
  SimpleString::~SimpleString(&local_68);
  SimpleString::~SimpleString(&local_58);
  pUVar4 = UtestShell::getCurrent();
  uVar1 = local_18;
  SimpleString::SimpleString(&local_78,"");
  pMVar3 = mock(&local_78,(MockFailureReporter *)0x0);
  iVar2 = (*pMVar3->_vptr_MockSupport[0x1f])(pMVar3,local_18);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x14])
            (pUVar4,uVar1,CONCAT44(extraout_var_00,iVar2),0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x2c0,pTVar6);
  SimpleString::~SimpleString(&local_78);
  return;
}

Assistant:

TEST(MockReturnValueTest, WhenNoFunctionPointerReturnValueIsExpectedButThereIsADefaultShouldlUseTheDefaultValue)
{
    void (*default_return_value)() = (void(*)()) 0x10;
    mock().expectOneCall("foo");
    FUNCTIONPOINTERS_EQUAL(default_return_value, mock().actualCall("foo").returnFunctionPointerValueOrDefault(default_return_value));
    FUNCTIONPOINTERS_EQUAL(default_return_value, mock().returnFunctionPointerValueOrDefault(default_return_value));
}